

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O2

void triangularToSquareHessian
               (HighsHessian *hessian,vector<int,_std::allocator<int>_> *start,
               vector<int,_std::allocator<int>_> *index,
               vector<double,_std::allocator<double>_> *value)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  int iVar10;
  ulong __n;
  size_type __new_size;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  vector<int,_std::allocator<int>_> length;
  value_type_conflict2 local_34;
  
  uVar2 = hessian->dim_;
  __n = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(start,1,(value_type_conflict2 *)&length);
  }
  else {
    iVar10 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[__n];
    std::vector<int,_std::allocator<int>_>::resize(start,__n + 1);
    __new_size = (size_type)(int)(iVar10 * 2 - uVar2);
    std::vector<int,_std::allocator<int>_>::resize(index,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(value,__new_size);
    length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&length,__n,&local_34);
    piVar4 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    while (uVar11 = uVar12, uVar11 != __n) {
      length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar11] = length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11] + 1;
      lVar13 = (long)piVar4[uVar11];
      while (lVar13 = lVar13 + 1, uVar12 = uVar11 + 1, lVar13 < piVar4[uVar11 + 1]) {
        length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[piVar5[lVar13]] =
             length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[piVar5[lVar13]] + 1;
        length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar11] =
             length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar11] + 1;
      }
    }
    piVar4 = (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    *piVar4 = 0;
    iVar10 = 0;
    for (uVar12 = 0; __n != uVar12; uVar12 = uVar12 + 1) {
      iVar10 = iVar10 + length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar12];
      piVar4[uVar12 + 1] = iVar10;
    }
    piVar5 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar8 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    while (uVar11 = uVar12, uVar11 != __n) {
      iVar10 = piVar5[uVar11];
      iVar3 = piVar4[uVar11];
      piVar7[iVar3] = piVar6[iVar10];
      pdVar9[iVar3] = pdVar8[iVar10];
      piVar4[uVar11] = piVar4[uVar11] + 1;
      lVar13 = (long)piVar5[uVar11];
      while (lVar13 = lVar13 + 1, uVar12 = uVar11 + 1, lVar13 < piVar5[uVar11 + 1]) {
        iVar10 = piVar6[lVar13];
        iVar3 = piVar4[iVar10];
        piVar7[iVar3] = (int)uVar11;
        dVar1 = pdVar8[lVar13];
        pdVar9[iVar3] = dVar1;
        piVar4[iVar10] = piVar4[iVar10] + 1;
        iVar3 = piVar4[uVar11];
        piVar7[iVar3] = iVar10;
        pdVar9[iVar3] = dVar1;
        piVar4[uVar11] = piVar4[uVar11] + 1;
      }
    }
    *piVar4 = 0;
    iVar10 = 0;
    for (uVar12 = 0; __n != uVar12; uVar12 = uVar12 + 1) {
      iVar10 = iVar10 + length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar12];
      piVar4[uVar12 + 1] = iVar10;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&length.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void triangularToSquareHessian(const HighsHessian& hessian,
                               vector<HighsInt>& start, vector<HighsInt>& index,
                               vector<double>& value) {
  const HighsInt dim = hessian.dim_;
  if (dim <= 0) {
    start.assign(1, 0);
    return;
  }
  assert(hessian.format_ == HessianFormat::kTriangular);
  const HighsInt nnz = hessian.start_[dim];
  const HighsInt square_nnz = nnz + (nnz - dim);
  start.resize(dim + 1);
  index.resize(square_nnz);
  value.resize(square_nnz);
  vector<HighsInt> length;
  length.assign(dim, 0);
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iRow = hessian.index_[hessian.start_[iCol]];
    assert(iRow == iCol);
    length[iCol]++;
    for (HighsInt iEl = hessian.start_[iCol] + 1;
         iEl < hessian.start_[iCol + 1]; iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      assert(iRow > iCol);
      length[iRow]++;
      length[iCol]++;
    }
  }
  start[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++)
    start[iCol + 1] = start[iCol] + length[iCol];
  assert(square_nnz == start[dim]);
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iEl = hessian.start_[iCol];
    HighsInt iRow = hessian.index_[iEl];
    HighsInt toEl = start[iCol];
    index[toEl] = iRow;
    value[toEl] = hessian.value_[iEl];
    start[iCol]++;
    for (HighsInt iEl = hessian.start_[iCol] + 1;
         iEl < hessian.start_[iCol + 1]; iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      HighsInt toEl = start[iRow];
      index[toEl] = iCol;
      value[toEl] = hessian.value_[iEl];
      start[iRow]++;
      toEl = start[iCol];
      index[toEl] = iRow;
      value[toEl] = hessian.value_[iEl];
      start[iCol]++;
    }
  }
  start[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++)
    start[iCol + 1] = start[iCol] + length[iCol];
}